

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask31_8(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar1 = *(undefined1 (*) [16])(in + 1);
  uVar2 = in[7];
  auVar6 = vpsllvd_avx2(auVar1,_DAT_001a4170);
  auVar4 = vpshufd_avx(auVar1,0xe9);
  auVar5 = vpsrlvd_avx2(auVar4,_DAT_001994d0);
  auVar4 = vpinsrd_avx(ZEXT416(*in),in[1] >> 1,1);
  uVar3 = *(ulong *)(in + 5);
  auVar4 = vpunpcklqdq_avx(auVar4,auVar5);
  auVar4 = vpor_avx(auVar6,auVar4);
  *(undefined1 (*) [16])out = auVar4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar1 = vpalignr_avx(auVar6,auVar1,0xc);
  auVar4 = vpsrlvd_avx2(auVar1,_DAT_001a4180);
  auVar1 = vpsllvd_avx2(auVar6,_DAT_001a4190);
  auVar1 = vpor_avx(auVar1,auVar4);
  *(long *)(out + 4) = auVar1._0_8_;
  out[6] = uVar2 << 0x19 | (uint)(uVar3 >> 0x26);
  out[7] = uVar2 >> 7;
  return out + 8;
}

Assistant:

uint32_t *__fastpackwithoutmask31_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (31 - 30);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (31 - 29);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (31 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (31 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (31 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (31 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (31 - 24);
  ++in;

  return out + 1;
}